

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLRootParser15.cpp
# Opt level: O0

LibraryKinematicsScenesLoader * __thiscall
COLLADASaxFWL::RootParser15::
beginCommonWithId<COLLADASaxFWL::LibraryKinematicsScenesLoader,COLLADASaxFWL::LibraryKinematicsScenesLoader15>
          (RootParser15 *this,char *id)

{
  LibraryKinematicsScenesLoader *this_00;
  IParserImpl *parserImpl;
  LibraryKinematicsScenesLoader *in_RDI;
  LibraryKinematicsScenesLoader15 *loader15;
  LibraryKinematicsScenesLoader *loader;
  LibraryKinematicsScenesLoader *in_stack_ffffffffffffff98;
  LibraryKinematicsScenesLoader15 *in_stack_ffffffffffffffa0;
  IParserImpl *local_50;
  IFilePartLoader *in_stack_ffffffffffffffb8;
  
  IFilePartLoader::deleteFilePartLoader((IFilePartLoader *)in_stack_ffffffffffffffa0);
  this_00 = (LibraryKinematicsScenesLoader *)operator_new(0xa0);
  LibraryKinematicsScenesLoader::LibraryKinematicsScenesLoader(in_RDI,in_stack_ffffffffffffffb8);
  parserImpl = (IParserImpl *)operator_new(0x20);
  LibraryKinematicsScenesLoader15::LibraryKinematicsScenesLoader15
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  IFilePartLoader::setParserImpl((IFilePartLoader *)this_00,parserImpl);
  IFilePartLoader::setPartLoader
            ((IFilePartLoader *)in_RDI->mCurrentKinematicsScene,(IFilePartLoader *)this_00);
  local_50 = (IParserImpl *)0x0;
  if (parserImpl != (IParserImpl *)0x0) {
    local_50 = parserImpl + 1;
  }
  (*(in_RDI->mCurrentKinematicsScene->super_IntermediateTargetableTemplate<6UL>).
    super_IntermediateTargetable._vptr_IntermediateTargetable[10])
            (in_RDI->mCurrentKinematicsScene,local_50);
  DocumentProcessor::addToSidTree((DocumentProcessor *)this,id,(char *)loader);
  return this_00;
}

Assistant:

Loader* RootParser15::beginCommonWithId( const char * id)
	{
		mFileLoader->deleteFilePartLoader();
		Loader* loader = new Loader(mFileLoader);
		Loader15* loader15 = new Loader15(loader);
		loader->setParserImpl( loader15 );
		mFileLoader->setPartLoader(loader);
		mFileLoader->setParser(loader15);
		mFileLoader->addToSidTree( id, 0);
		return loader;
	}